

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Char * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **format_str,Arg *arg)

{
  char cVar1;
  undefined8 fmt;
  bool bVar2;
  char *pcVar3;
  FormatError *pFVar4;
  long lVar5;
  char (*local_230) [8];
  ArgFormatter<char> local_198;
  CStringRef local_178;
  undefined1 local_169;
  CStringRef local_168;
  string local_160;
  CStringRef local_140;
  CStringRef local_138;
  CStringRef local_130;
  uint local_124;
  BasicCStringRef<char> BStack_120;
  uint max_int_1;
  CStringRef local_118;
  CStringRef local_110;
  ulong local_108;
  ULongLong value_1;
  undefined1 local_f8 [8];
  Arg precision_arg;
  CStringRef local_d0;
  uint local_c4;
  BasicCStringRef<char> BStack_c0;
  uint max_int;
  CStringRef local_b8;
  CStringRef local_b0;
  ulong local_a8;
  ULongLong value;
  undefined1 local_98 [8];
  Arg width_arg;
  CStringRef local_60;
  char *local_58;
  Char *p;
  undefined1 local_48 [7];
  Char c;
  SpecType spec;
  Char *s;
  Arg *arg_local;
  Char **format_str_local;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *this_local;
  
  spec._16_8_ = *format_str;
  FormatSpec::FormatSpec((FormatSpec *)local_48,0,'\0',L' ');
  if (*(char *)spec._16_8_ == ':') {
    if (arg->type == CUSTOM) {
      (*(arg->super_Value).field_0.custom.format)
                (this,(void *)(arg->super_Value).field_0.long_long_value,&spec.precision_);
      return (Char *)spec._16_8_;
    }
    pcVar3 = (char *)(spec._16_8_ + 1);
    p._7_1_ = *pcVar3;
    if (p._7_1_ != '\0') {
      local_58 = (char *)(spec._16_8_ + 2);
      spec.super_AlignSpec.super_WidthSpec.width_ = 0;
      do {
        switch(*local_58) {
        case '<':
          spec.super_AlignSpec.super_WidthSpec.width_ = 1;
          break;
        case '=':
          spec.super_AlignSpec.super_WidthSpec.width_ = 4;
          break;
        case '>':
          spec.super_AlignSpec.super_WidthSpec.width_ = 2;
          break;
        case '^':
          spec.super_AlignSpec.super_WidthSpec.width_ = 3;
        }
        if (spec.super_AlignSpec.super_WidthSpec.width_ != 0) {
          if (local_58 == pcVar3) {
            spec._16_8_ = spec._16_8_ + 2;
          }
          else {
            if (p._7_1_ == '}') break;
            if (p._7_1_ == '{') {
              spec._16_8_ = pcVar3;
              pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
              BasicCStringRef<char>::BasicCStringRef(&local_60,"invalid fill character \'{\'");
              FormatError::FormatError(pFVar4,local_60);
              __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
            }
            spec._16_8_ = spec._16_8_ + 3;
            register0x00000000 = (wchar_t)p._7_1_;
          }
          pcVar3 = (char *)spec._16_8_;
          if (spec.super_AlignSpec.super_WidthSpec.width_ == 4) {
            internal::require_numeric_argument(arg,'=');
            pcVar3 = (char *)spec._16_8_;
          }
          break;
        }
        local_58 = local_58 + -1;
      } while (pcVar3 <= local_58);
    }
    spec._16_8_ = pcVar3;
    cVar1 = *(char *)spec._16_8_;
    if (cVar1 == ' ') {
      internal::check_sign<char>((char **)&spec.precision_,arg);
      spec.super_AlignSpec.super_WidthSpec.fill_ = spec.super_AlignSpec.super_WidthSpec.fill_ | 1;
    }
    else if (cVar1 == '+') {
      internal::check_sign<char>((char **)&spec.precision_,arg);
      spec.super_AlignSpec.super_WidthSpec.fill_ = spec.super_AlignSpec.super_WidthSpec.fill_ | 3;
    }
    else if (cVar1 == '-') {
      internal::check_sign<char>((char **)&spec.precision_,arg);
      spec.super_AlignSpec.super_WidthSpec.fill_ = spec.super_AlignSpec.super_WidthSpec.fill_ | 4;
    }
    if (*(char *)spec._16_8_ == '#') {
      internal::require_numeric_argument(arg,'#');
      spec.super_AlignSpec.super_WidthSpec.fill_ = spec.super_AlignSpec.super_WidthSpec.fill_ | 8;
      spec._16_8_ = spec._16_8_ + 1;
    }
    if (*(char *)spec._16_8_ == '0') {
      internal::require_numeric_argument(arg,'0');
      spec.super_AlignSpec.super_WidthSpec.width_ = 4;
      stack0xffffffffffffffbc = L'0';
      spec._16_8_ = spec._16_8_ + 1;
    }
    if ((*(char *)spec._16_8_ < '0') || ('9' < *(char *)spec._16_8_)) {
      if (*(char *)spec._16_8_ == '{') {
        spec._16_8_ = spec._16_8_ + 1;
        bVar2 = internal::is_name_start<char>(*(char *)spec._16_8_);
        if (bVar2) {
          parse_arg_name((Arg *)local_98,this,(Char **)&spec.precision_);
        }
        else {
          parse_arg_index((Arg *)local_98,this,(Char **)&spec.precision_);
        }
        lVar5 = spec._16_8_ + 1;
        if (*(char *)spec._16_8_ != '}') {
          spec._16_8_ = lVar5;
          pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef
                    ((BasicCStringRef<char> *)&value,"invalid format string");
          FormatError::FormatError(pFVar4,(CStringRef)value);
          __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
        }
        local_a8 = 0;
        switch(width_arg.super_Value.field_0.string.size._0_4_) {
        case 2:
          if ((int)local_98._0_4_ < 0) {
            spec._16_8_ = lVar5;
            pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
            BasicCStringRef<char>::BasicCStringRef(&local_b0,"negative width");
            FormatError::FormatError(pFVar4,local_b0);
            __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
          }
          local_a8 = (ulong)(int)local_98._0_4_;
          break;
        case 3:
          local_a8 = (ulong)(uint)local_98._0_4_;
          break;
        case 4:
          if ((int)local_98._4_4_ < 0) {
            spec._16_8_ = lVar5;
            pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
            BasicCStringRef<char>::BasicCStringRef(&local_b8,"negative width");
            FormatError::FormatError(pFVar4,local_b8);
            __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
          }
          local_a8 = CONCAT44(local_98._4_4_,local_98._0_4_);
          break;
        case 5:
          local_a8 = CONCAT44(local_98._4_4_,local_98._0_4_);
          break;
        default:
          spec._16_8_ = lVar5;
          pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&stack0xffffffffffffff40,"width is not integer");
          FormatError::FormatError(pFVar4,(CStringRef)BStack_c0.data_);
          __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
        }
        spec._16_8_ = lVar5;
        local_c4 = std::numeric_limits<int>::max();
        if (local_c4 < local_a8) {
          pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_d0,"number is too big");
          FormatError::FormatError(pFVar4,local_d0);
          __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
        }
        local_48._0_4_ = (undefined4)local_a8;
      }
    }
    else {
      local_48._0_4_ = internal::parse_nonnegative_int<char>((char **)&spec.precision_);
    }
    if (*(char *)spec._16_8_ == '.') {
      pcVar3 = (char *)(spec._16_8_ + 1);
      spec.super_AlignSpec.align_ = ALIGN_DEFAULT;
      if ((*pcVar3 < '0') || ('9' < *pcVar3)) {
        if (*pcVar3 != '{') {
          spec._16_8_ = pcVar3;
          pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_138,"missing precision specifier");
          FormatError::FormatError(pFVar4,local_138);
          __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
        }
        spec._16_8_ = spec._16_8_ + 2;
        bVar2 = internal::is_name_start<char>(*(char *)spec._16_8_);
        if (bVar2) {
          parse_arg_name((Arg *)local_f8,this,(Char **)&spec.precision_);
        }
        else {
          parse_arg_index((Arg *)local_f8,this,(Char **)&spec.precision_);
        }
        lVar5 = spec._16_8_ + 1;
        if (*(char *)spec._16_8_ != '}') {
          spec._16_8_ = lVar5;
          pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef
                    ((BasicCStringRef<char> *)&value_1,"invalid format string");
          FormatError::FormatError(pFVar4,(CStringRef)value_1);
          __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
        }
        local_108 = 0;
        switch(precision_arg.super_Value.field_0.string.size._0_4_) {
        case 2:
          if ((int)local_f8._0_4_ < 0) {
            spec._16_8_ = lVar5;
            pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
            BasicCStringRef<char>::BasicCStringRef(&local_110,"negative precision");
            FormatError::FormatError(pFVar4,local_110);
            __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
          }
          local_108 = (ulong)(int)local_f8._0_4_;
          break;
        case 3:
          local_108 = (ulong)(uint)local_f8._0_4_;
          break;
        case 4:
          if ((int)local_f8._4_4_ < 0) {
            spec._16_8_ = lVar5;
            pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
            BasicCStringRef<char>::BasicCStringRef(&local_118,"negative precision");
            FormatError::FormatError(pFVar4,local_118);
            __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
          }
          local_108 = CONCAT44(local_f8._4_4_,local_f8._0_4_);
          break;
        case 5:
          local_108 = CONCAT44(local_f8._4_4_,local_f8._0_4_);
          break;
        default:
          spec._16_8_ = lVar5;
          pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef
                    (&stack0xfffffffffffffee0,"precision is not integer");
          FormatError::FormatError(pFVar4,(CStringRef)BStack_120.data_);
          __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
        }
        spec._16_8_ = lVar5;
        local_124 = std::numeric_limits<int>::max();
        if (local_124 < local_108) {
          pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_130,"number is too big");
          FormatError::FormatError(pFVar4,local_130);
          __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
        }
        spec.super_AlignSpec.align_ = (Alignment)local_108;
      }
      else {
        spec._16_8_ = pcVar3;
        spec.super_AlignSpec.align_ =
             internal::parse_nonnegative_int<char>((char **)&spec.precision_);
      }
      if (((int)arg->type < 8) || (arg->type == POINTER)) {
        local_169 = 1;
        pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
        BasicCStringRef<char>::BasicCStringRef
                  (&local_168,"precision not allowed in {} format specifier");
        if (arg->type == POINTER) {
          local_230 = (char (*) [8])0x278af2;
        }
        else {
          local_230 = (char (*) [8])0x278a75;
        }
        format<char[8]>(&local_160,local_168,local_230);
        BasicCStringRef<char>::BasicCStringRef<std::allocator<char>>(&local_140,&local_160);
        FormatError::FormatError(pFVar4,local_140);
        local_169 = 0;
        __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
      }
    }
    if ((*(char *)spec._16_8_ != '}') && (*(char *)spec._16_8_ != '\0')) {
      spec.flags_._0_1_ = *(undefined1 *)spec._16_8_;
      spec._16_8_ = spec._16_8_ + 1;
    }
  }
  fmt = spec._16_8_;
  if (*(char *)spec._16_8_ == '}') {
    spec._16_8_ = spec._16_8_ + 1;
    ArgFormatter<char>::ArgFormatter(&local_198,this,(FormatSpec *)local_48,(char *)fmt);
    ArgVisitor<fmt::ArgFormatter<char>,_void>::visit
              ((ArgVisitor<fmt::ArgFormatter<char>,_void> *)&local_198,arg);
    return (Char *)spec._16_8_;
  }
  spec._16_8_ = spec._16_8_ + 1;
  pFVar4 = (FormatError *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef(&local_178,"missing \'}\' in format string");
  FormatError::FormatError(pFVar4,local_178);
  __cxa_throw(pFVar4,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

const Char *BasicFormatter<Char, ArgFormatter>::format(const Char *&format_str, const internal::Arg &arg)
{
    using internal::Arg;
    const Char *s = format_str;
    typename ArgFormatter::SpecType spec;
    if (*s == ':')
    {
        if (arg.type == Arg::CUSTOM)
        {
            arg.custom.format(this, arg.custom.value, &s);
            return s;
        }
        ++s;
        // Parse fill and alignment.
        if (Char c = *s)
        {
            const Char *p = s + 1;
            spec.align_ = ALIGN_DEFAULT;
            do
            {
                switch (*p)
                {
                case '<':
                    spec.align_ = ALIGN_LEFT;
                    break;
                case '>':
                    spec.align_ = ALIGN_RIGHT;
                    break;
                case '=':
                    spec.align_ = ALIGN_NUMERIC;
                    break;
                case '^':
                    spec.align_ = ALIGN_CENTER;
                    break;
                }
                if (spec.align_ != ALIGN_DEFAULT)
                {
                    if (p != s)
                    {
                        if (c == '}')
                            break;
                        if (c == '{')
                            FMT_THROW(FormatError("invalid fill character '{'"));
                        s += 2;
                        spec.fill_ = c;
                    }
                    else
                        ++s;
                    if (spec.align_ == ALIGN_NUMERIC)
                        require_numeric_argument(arg, '=');
                    break;
                }
            } while (--p >= s);
        }

        // Parse sign.
        switch (*s)
        {
        case '+':
            check_sign(s, arg);
            spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
            break;
        case '-':
            check_sign(s, arg);
            spec.flags_ |= MINUS_FLAG;
            break;
        case ' ':
            check_sign(s, arg);
            spec.flags_ |= SIGN_FLAG;
            break;
        }

        if (*s == '#')
        {
            require_numeric_argument(arg, '#');
            spec.flags_ |= HASH_FLAG;
            ++s;
        }

        // Parse zero flag.
        if (*s == '0')
        {
            require_numeric_argument(arg, '0');
            spec.align_ = ALIGN_NUMERIC;
            spec.fill_ = '0';
            ++s;
        }

        // Parse width.
        if ('0' <= *s && *s <= '9')
        {
            spec.width_ = internal::parse_nonnegative_int(s);
        }
        else if (*s == '{')
        {
            ++s;
            Arg width_arg = internal::is_name_start(*s) ? parse_arg_name(s) : parse_arg_index(s);
            if (*s++ != '}')
                FMT_THROW(FormatError("invalid format string"));
            ULongLong value = 0;
            switch (width_arg.type)
            {
            case Arg::INT:
                if (width_arg.int_value < 0)
                    FMT_THROW(FormatError("negative width"));
                value = width_arg.int_value;
                break;
            case Arg::UINT:
                value = width_arg.uint_value;
                break;
            case Arg::LONG_LONG:
                if (width_arg.long_long_value < 0)
                    FMT_THROW(FormatError("negative width"));
                value = width_arg.long_long_value;
                break;
            case Arg::ULONG_LONG:
                value = width_arg.ulong_long_value;
                break;
            default:
                FMT_THROW(FormatError("width is not integer"));
            }
            unsigned max_int = (std::numeric_limits<int>::max)();
            if (value > max_int)
                FMT_THROW(FormatError("number is too big"));
            spec.width_ = static_cast<int>(value);
        }

        // Parse precision.
        if (*s == '.')
        {
            ++s;
            spec.precision_ = 0;
            if ('0' <= *s && *s <= '9')
            {
                spec.precision_ = internal::parse_nonnegative_int(s);
            }
            else if (*s == '{')
            {
                ++s;
                Arg precision_arg = internal::is_name_start(*s) ? parse_arg_name(s) : parse_arg_index(s);
                if (*s++ != '}')
                    FMT_THROW(FormatError("invalid format string"));
                ULongLong value = 0;
                switch (precision_arg.type)
                {
                case Arg::INT:
                    if (precision_arg.int_value < 0)
                        FMT_THROW(FormatError("negative precision"));
                    value = precision_arg.int_value;
                    break;
                case Arg::UINT:
                    value = precision_arg.uint_value;
                    break;
                case Arg::LONG_LONG:
                    if (precision_arg.long_long_value < 0)
                        FMT_THROW(FormatError("negative precision"));
                    value = precision_arg.long_long_value;
                    break;
                case Arg::ULONG_LONG:
                    value = precision_arg.ulong_long_value;
                    break;
                default:
                    FMT_THROW(FormatError("precision is not integer"));
                }
                unsigned max_int = (std::numeric_limits<int>::max)();
                if (value > max_int)
                    FMT_THROW(FormatError("number is too big"));
                spec.precision_ = static_cast<int>(value);
            }
            else
            {
                FMT_THROW(FormatError("missing precision specifier"));
            }
            if (arg.type <= Arg::LAST_INTEGER_TYPE || arg.type == Arg::POINTER)
            {
                FMT_THROW(FormatError(
                    fmt::format("precision not allowed in {} format specifier", arg.type == Arg::POINTER ? "pointer" : "integer")));
            }
        }

        // Parse type.
        if (*s != '}' && *s)
            spec.type_ = static_cast<char>(*s++);
    }

    if (*s++ != '}')
        FMT_THROW(FormatError("missing '}' in format string"));

    // Format argument.
    ArgFormatter(*this, spec, s - 1).visit(arg);
    return s;
}